

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::TestEventListeners::SetDefaultXmlGenerator
          (TestEventListeners *this,TestEventListener *listener)

{
  TestEventListener *pTVar1;
  
  if (this->default_xml_generator_ != listener) {
    pTVar1 = Release(this,this->default_xml_generator_);
    if (pTVar1 != (TestEventListener *)0x0) {
      (*pTVar1->_vptr_TestEventListener[1])(pTVar1);
    }
    this->default_xml_generator_ = listener;
    if (listener != (TestEventListener *)0x0) {
      Append(this,listener);
      return;
    }
  }
  return;
}

Assistant:

void TestEventListeners::SetDefaultXmlGenerator(TestEventListener* listener) {
  if (default_xml_generator_ != listener) {
    // It is an error to pass this method a listener that is already in the
    // list.
    delete Release(default_xml_generator_);
    default_xml_generator_ = listener;
    if (listener != NULL)
      Append(listener);
  }
}